

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void unstuff58bits(uint thumbH_word1,uint thumbH_word2,uint *thumbH58_word1,uint *thumbH58_word2)

{
  uint part3;
  uint part2;
  uint part1;
  uint part0;
  uint *thumbH58_word2_local;
  uint *thumbH58_word1_local;
  uint thumbH_word2_local;
  uint thumbH_word1_local;
  
  *thumbH58_word1 = 0;
  *thumbH58_word1 = *thumbH58_word1 & 0xfc07ffff | (thumbH_word1 >> 0x18 & 0x7f) << 0x13;
  *thumbH58_word1 = *thumbH58_word1 & 0xfff9ffff | (thumbH_word1 >> 0x13 & 3) << 0x11;
  *thumbH58_word1 = *thumbH58_word1 & 0xfffe0001 | (thumbH_word1 >> 2 & 0xffff) << 1;
  *thumbH58_word1 = *thumbH58_word1 & 0xfffffffe | thumbH_word1 & 1;
  *thumbH58_word2 = thumbH_word2;
  return;
}

Assistant:

void unstuff58bits(unsigned int thumbH_word1, unsigned int thumbH_word2, unsigned int &thumbH58_word1, unsigned int &thumbH58_word2)
{
	// Go to this layout:
	//
	//     |63 62 61 60 59 58|57 56 55 54 53 52 51|50 49|48 47 46 45 44 43 42 41 40 39 38 37 36 35 34 33|32   |
	//     |-------empty-----|part0---------------|part1|part2------------------------------------------|part3|
	//
	//  from this:
	// 
	//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34 33 32 
	//      --------------------------------------------------------------------------------------------------|
	//     |//|part0               |// // //|part1|//|part2                                          |df|part3|
	//      --------------------------------------------------------------------------------------------------|

	unsigned int part0, part1, part2, part3;

	// move parts
	part0 = GETBITSHIGH( thumbH_word1, 7, 62);
	part1 = GETBITSHIGH( thumbH_word1, 2, 52);
	part2 = GETBITSHIGH( thumbH_word1,16, 49);
	part3 = GETBITSHIGH( thumbH_word1, 1, 32);
	thumbH58_word1 = 0;
	PUTBITSHIGH( thumbH58_word1, part0,  7, 57);
	PUTBITSHIGH( thumbH58_word1, part1,  2, 50);
	PUTBITSHIGH( thumbH58_word1, part2, 16, 48);
	PUTBITSHIGH( thumbH58_word1, part3,  1, 32);

	thumbH58_word2 = thumbH_word2;
}